

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(CompilerMSL *this,string *ep_args)

{
  SmallVector<unsigned_int,_8UL> *pSVar1;
  StorageClass SVar2;
  size_t sVar3;
  Variant *pVVar4;
  _func_int **pp_Var5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  string *psVar15;
  undefined8 *puVar16;
  char cVar17;
  bool bVar18;
  char cVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  SPIRVariable *pSVar22;
  SPIRVariable *pSVar23;
  mapped_type *pmVar24;
  const_iterator cVar25;
  undefined8 *puVar26;
  SPIRType *pSVar27;
  mapped_type *pmVar28;
  long *plVar29;
  SPIRType *pSVar30;
  _func_int **pp_Var31;
  runtime_error *prVar32;
  uint uVar33;
  size_type *psVar34;
  ulong *puVar35;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar36;
  uint uVar37;
  SPIRVariable *pSVar38;
  undefined8 *puVar39;
  uint32_t plane;
  undefined8 *puVar40;
  SPIRType *pSVar41;
  SPIRVariable *pSVar42;
  undefined8 uVar43;
  _Alloc_hider _Var44;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_R9;
  long lVar45;
  ulong uVar46;
  long lVar47;
  CompilerMSL *pCVar48;
  ulong uVar49;
  uint uVar50;
  byte bVar51;
  string __str_1;
  uint32_t var_id;
  string primary_name;
  __hashtable *__h;
  string __str;
  SmallVector<Resource,_8UL> resources;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  string *local_3e8;
  CompilerMSL *local_3e0;
  string local_3d8;
  ID local_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  BaseType local_380;
  uint32_t local_37c;
  undefined8 local_378;
  SPIRType *local_370;
  SPIRVariable *local_368;
  string local_360;
  string local_340;
  string local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_300;
  Parameter *local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  SPIRVariable *local_2e0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_2d8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_2d0;
  SPIRType *local_2c8;
  SPIRType *local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  uint local_2b0;
  undefined4 uStack_2ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298;
  long local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  SmallVector<unsigned_int,_8UL> *local_278;
  SmallVector<unsigned_int,_8UL> *local_270;
  string local_268;
  undefined1 local_248 [536];
  
  bVar51 = 0;
  local_248._0_8_ = local_248 + 0x18;
  local_248._8_8_ = 0;
  local_248._16_8_ = 8;
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_3e8 = ep_args;
  local_3e0 = this;
  if (sVar3 != 0) {
    pSVar27 = (SPIRType *)
              (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pSVar41 = (SPIRType *)((long)(&(pSVar27->array).stack_storage + -2) + 8 + sVar3 * 4);
    local_2e0 = (SPIRVariable *)&(this->super_CompilerGLSL).super_Compiler.interlocked_resources;
    local_2d8 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&this->constexpr_samplers_by_id;
    local_2d0 = &(this->atomic_image_vars)._M_h;
    local_2c8 = pSVar41;
    do {
      local_368 = (SPIRVariable *)(ulong)*(uint *)&(pSVar27->super_IVariant)._vptr_IVariant;
      pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[(long)local_368].type == TypeVariable) {
        local_2c0 = pSVar27;
        pSVar22 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + (long)local_368);
        local_3d8._M_dataplus._M_p._0_4_ = (int)local_368;
        pSVar27 = local_2c0;
        pSVar41 = local_2c8;
        this = local_3e0;
        if (((pSVar22->storage < (StorageClassStorageBuffer|StorageClassInput)) &&
            ((0x1205U >> (pSVar22->storage & 0x1f) & 1) != 0)) &&
           (bVar18 = Compiler::is_hidden_variable((Compiler *)local_3e0,pSVar22,false),
           pSVar27 = local_2c0, pSVar41 = local_2c8, this = local_3e0, !bVar18)) {
          local_370 = Compiler::get_variable_data_type((Compiler *)local_3e0,pSVar22);
          pCVar48 = local_3e0;
          bVar18 = is_supported_argument_buffer_type(local_3e0,local_370);
          SVar2 = pSVar22->storage;
          if (SVar2 != StorageClassPushConstant && bVar18) {
            uVar20 = Compiler::get_decoration
                               ((Compiler *)pCVar48,(ID)(uint32_t)local_368,DecorationDescriptorSet)
            ;
            if (((uVar20 < 8) && ((local_3e0->msl_options).argument_buffers != false)) &&
               (pSVar27 = local_2c0, pSVar41 = local_2c8, this = local_3e0,
               (local_3e0->argument_buffer_discrete_mask >> (uVar20 & 0x1f) & 1) == 0))
            goto LAB_002df6cd;
            SVar2 = pSVar22->storage;
            pCVar48 = local_3e0;
          }
          uVar43 = local_248._0_8_;
          if (((SVar2 == StorageClassStorageBuffer) || (SVar2 == StorageClassUniform)) &&
             (local_248._8_8_ != 0)) {
            lVar45 = local_248._8_8_ << 6;
            lVar47 = 0;
            do {
              pCVar48 = local_3e0;
              uVar20 = Compiler::get_decoration
                                 ((Compiler *)local_3e0,
                                  (ID)*(uint32_t *)
                                       (*(long *)((long)(&((SmallVector<unsigned_int,_8UL> *)
                                                          (uVar43 + 0x20))->stack_storage + -2) + 8
                                                 + lVar47) + 8),DecorationDescriptorSet);
              uVar21 = Compiler::get_decoration
                                 ((Compiler *)pCVar48,(ID)(uint32_t)local_368,
                                  DecorationDescriptorSet);
              pCVar48 = local_3e0;
              if (uVar20 == uVar21) {
                uVar20 = Compiler::get_decoration
                                   ((Compiler *)local_3e0,
                                    (ID)*(uint32_t *)
                                         (*(long *)((long)(&((SmallVector<unsigned_int,_8UL> *)
                                                            (uVar43 + 0x20))->stack_storage + -2) +
                                                    8 + lVar47) + 8),DecorationBinding);
                uVar21 = Compiler::get_decoration
                                   ((Compiler *)pCVar48,(ID)(uint32_t)local_368,DecorationBinding);
                if (((uVar20 == uVar21) &&
                    (*(int *)((long)(&((SmallVector<unsigned_int,_8UL> *)(uVar43 + 0x20))->
                                      stack_storage + -1) + 0x18 + lVar47) == 0xf)) &&
                   (*(int *)&(local_370->super_IVariant).field_0xc == 0xf)) {
                  pSVar38 = *(SPIRVariable **)
                             ((long)(&((SmallVector<unsigned_int,_8UL> *)(uVar43 + 0x20))->
                                      stack_storage + -2) + 8 + lVar47);
                  if ((pSVar38->storage == StorageClassStorageBuffer) ||
                     (pSVar38->storage == StorageClassUniform)) {
                    if ((local_370->array).super_VectorView<unsigned_int>.buffer_size != 0) {
                      prVar32 = (runtime_error *)__cxa_allocate_exception(0x10);
                      local_3b0._0_8_ = local_3a0;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_3b0,
                                 "Aliasing arrayed discrete descriptors is currently not supported."
                                 ,"");
                      ::std::runtime_error::runtime_error(prVar32,(string *)local_3b0);
                      *(undefined ***)prVar32 = &PTR__runtime_error_003f8e68;
                      __cxa_throw(prVar32,&CompilerError::typeinfo,
                                  ::std::runtime_error::~runtime_error);
                    }
                    *(SPIRVariable **)
                     ((long)(&((SmallVector<unsigned_int,_8UL> *)(uVar43 + 0x20))->stack_storage +
                            -2) + 0x10 + lVar47) = pSVar38;
                    cVar25 = ::std::
                             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                     *)local_2e0,(key_type *)&local_3d8);
                    pCVar48 = local_3e0;
                    if (cVar25.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                        (__node_type *)0x0) {
                      local_360._M_dataplus._M_p._0_4_ =
                           *(undefined4 *)
                            (*(long *)((long)(&((SmallVector<unsigned_int,_8UL> *)(uVar43 + 0x20))->
                                               stack_storage + -2) + 8 + lVar47) + 8);
                      local_3b0._0_8_ = local_2e0;
                      ::std::
                      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      ::
                      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                  *)local_2e0,&local_360,local_3b0);
                      pCVar48 = local_3e0;
                    }
                    goto LAB_002df40a;
                  }
                }
              }
              lVar47 = lVar47 + 0x40;
            } while (lVar45 != lVar47);
            pSVar38 = (SPIRVariable *)0x0;
            pCVar48 = local_3e0;
          }
          else {
            pSVar38 = (SPIRVariable *)0x0;
          }
LAB_002df40a:
          if (*(int *)&(local_370->super_IVariant).field_0xc - 0x11U < 2) {
            pSVar23 = (SPIRVariable *)
                      find_constexpr_sampler(pCVar48,(uint32_t)local_3d8._M_dataplus._M_p);
            if (pSVar23 == (SPIRVariable *)0x0) goto LAB_002df452;
            pmVar24 = ::std::
                      map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                      ::operator[]((map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                                    *)local_2d8,(key_type *)&local_3d8);
            pSVar42 = pSVar23;
            for (lVar45 = 0x19; lVar45 != 0; lVar45 = lVar45 + -1) {
              pmVar24->coord = *(MSLSamplerCoord *)&(pSVar42->super_IVariant)._vptr_IVariant;
              pSVar42 = (SPIRVariable *)((long)pSVar42 + (ulong)bVar51 * -8 + 4);
              pmVar24 = (mapped_type *)((long)pmVar24 + (ulong)bVar51 * -8 + 4);
            }
          }
          else {
LAB_002df452:
            pSVar23 = (SPIRVariable *)0x0;
          }
          local_3b0._0_4_ = (pSVar22->super_IVariant).self.id;
          cVar25 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(local_2d0,(key_type *)local_3b0);
          if (cVar25.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
            uVar20 = 0;
          }
          else {
            uVar20 = get_metal_resource_index(local_3e0,pSVar22,AtomicCounter,0);
          }
          if (*(int *)&(local_370->super_IVariant).field_0xc == 0x11) {
            CompilerGLSL::add_resource_name
                      (&local_3e0->super_CompilerGLSL,(uint32_t)local_3d8._M_dataplus._M_p);
            this = local_3e0;
            uVar21 = 1;
            if (((pSVar23 == (SPIRVariable *)0x0) ||
                (*(char *)((long)&(pSVar23->dependees).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr
                          + 3) != '\x01')) ||
               (uVar21 = (uint32_t)(pSVar23->dereference_chain).buffer_capacity, pSVar27 = local_2c0
               , pSVar41 = local_2c8, uVar21 != 0)) {
              plane = 0;
              local_368 = pSVar23;
              do {
                local_3b0._0_8_ = pSVar22;
                local_3b0._8_8_ = pSVar38;
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                          (local_3a0,this,(ulong)local_3d8._M_dataplus._M_p & 0xffffffff,1);
                local_380 = Image;
                local_37c = get_metal_resource_index(this,pSVar22,Image,plane);
                local_378 = CONCAT44(uVar20,plane);
                SmallVector<Resource,_8UL>::push_back
                          ((SmallVector<Resource,_8UL> *)local_248,(Resource *)local_3b0);
                if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
                  operator_delete((void *)local_3a0._0_8_);
                }
                plane = plane + 1;
              } while (uVar21 != plane);
              pSVar27 = local_2c0;
              pSVar41 = local_2c8;
              if ((local_368 == (SPIRVariable *)0x0) && ((local_370->image).dim != DimBuffer)) {
                local_3b0._0_8_ = pSVar22;
                local_3b0._8_8_ = pSVar38;
                to_sampler_expression_abi_cxx11_
                          ((string *)local_3a0,this,(uint32_t)local_3d8._M_dataplus._M_p);
                this = local_3e0;
                local_380 = Sampler;
                local_37c = get_metal_resource_index(local_3e0,pSVar22,Sampler,0);
                local_378 = 0;
                SmallVector<Resource,_8UL>::push_back
                          ((SmallVector<Resource,_8UL> *)local_248,(Resource *)local_3b0);
                pSVar27 = local_2c0;
                pSVar41 = local_2c8;
                if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
                  operator_delete((void *)local_3a0._0_8_);
                  pSVar27 = local_2c0;
                  pSVar41 = local_2c8;
                }
              }
            }
          }
          else {
            pSVar27 = local_2c0;
            pSVar41 = local_2c8;
            this = local_3e0;
            if (pSVar23 == (SPIRVariable *)0x0) {
              CompilerGLSL::add_resource_name
                        (&local_3e0->super_CompilerGLSL,(uint32_t)local_3d8._M_dataplus._M_p);
              uVar21 = 0xffffffff;
              if (pSVar38 == (SPIRVariable *)0x0) {
                uVar21 = get_metal_resource_index
                                   (local_3e0,pSVar22,
                                    *(BaseType *)&(local_370->super_IVariant).field_0xc,0);
              }
              local_3b0._0_8_ = pSVar22;
              local_3b0._8_8_ = pSVar38;
              (*(local_3e0->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (local_3a0,local_3e0,(ulong)local_3d8._M_dataplus._M_p & 0xffffffff,1);
              local_380 = *(BaseType *)&(local_370->super_IVariant).field_0xc;
              local_378 = (ulong)uVar20 << 0x20;
              local_37c = uVar21;
              SmallVector<Resource,_8UL>::push_back
                        ((SmallVector<Resource,_8UL> *)local_248,(Resource *)local_3b0);
              pSVar27 = local_2c0;
              pSVar41 = local_2c8;
              this = local_3e0;
              if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
                operator_delete((void *)local_3a0._0_8_);
                pSVar27 = local_2c0;
                pSVar41 = local_2c8;
                this = local_3e0;
              }
            }
          }
        }
      }
LAB_002df6cd:
      pSVar27 = (SPIRType *)((long)&(pSVar27->super_IVariant)._vptr_IVariant + 4);
    } while (pSVar27 != pSVar41);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_408);
  uVar43 = local_248._0_8_;
  lVar45 = (long)(local_248._0_8_ + 0x20) + local_248._8_8_ * 0x40 + -0x20;
  if (local_248._8_8_ != 0) {
    uVar49 = local_248._8_8_;
    if (0 < (long)local_248._8_8_) {
LAB_002df775:
      uVar46 = uVar49 + 1 >> 1;
      puVar26 = (undefined8 *)operator_new(uVar46 << 6,(nothrow_t *)&::std::nothrow);
      if (puVar26 == (undefined8 *)0x0) goto code_r0x002df790;
      uVar14 = *(undefined8 *)&((IVariant *)uVar43)->self;
      *puVar26 = ((IVariant *)uVar43)->_vptr_IVariant;
      puVar26[1] = uVar14;
      puVar40 = puVar26 + 4;
      puVar26[2] = puVar40;
      pSVar1 = (SmallVector<unsigned_int,_8UL> *)(uVar43 + 0x20);
      if ((SmallVector<unsigned_int,_8UL> *)*(undefined1 **)(uVar43 + 0x10) == pSVar1) {
        sVar3 = (((SmallVector<unsigned_int,_8UL> *)(uVar43 + 0x20))->super_VectorView<unsigned_int>
                ).buffer_size;
        *puVar40 = (pSVar1->super_VectorView<unsigned_int>).ptr;
        puVar26[5] = sVar3;
      }
      else {
        puVar26[2] = *(undefined1 **)(uVar43 + 0x10);
        puVar26[4] = (pSVar1->super_VectorView<unsigned_int>).ptr;
      }
      puVar26[3] = *(undefined8 *)(uVar43 + 0x18);
      *(SmallVector<unsigned_int,_8UL> **)(uVar43 + 0x10) = pSVar1;
      *(undefined8 *)(uVar43 + 0x18) = 0;
      *(undefined1 *)
       &(((SmallVector<unsigned_int,_8UL> *)(uVar43 + 0x20))->super_VectorView<unsigned_int>).ptr =
           0;
      local_368 = (SPIRVariable *)
                  &((SmallVector<unsigned_int,_8UL> *)(uVar43 + 0x20))->buffer_capacity;
      uVar14 = *(undefined8 *)
                (((SmallVector<unsigned_int,_8UL> *)(uVar43 + 0x20))->stack_storage).aligned_char;
      puVar26[6] = ((SmallVector<unsigned_int,_8UL> *)(uVar43 + 0x20))->buffer_capacity;
      puVar26[7] = uVar14;
      puVar39 = puVar26;
      if (uVar46 != 1) {
        lVar47 = (uVar49 * 0x20 + 0x20 & 0xffffffffffffffc0) - 0x40;
        puVar16 = puVar26 + 0xc;
        do {
          puVar39 = puVar16;
          puVar39[-4] = puVar39[-0xc];
          puVar39[-3] = puVar39[-0xb];
          puVar39[-2] = puVar39;
          puVar16 = puVar39 + -8;
          if (puVar16 == (undefined8 *)puVar39[-10]) {
            *puVar39 = *puVar16;
            puVar39[1] = puVar39[-7];
          }
          else {
            puVar39[-2] = (undefined8 *)puVar39[-10];
            *puVar39 = puVar39[-8];
          }
          puVar39[-1] = puVar39[-9];
          puVar39[-10] = puVar16;
          puVar39[-9] = 0;
          *(undefined1 *)(puVar39 + -8) = 0;
          puVar39[2] = puVar39[-6];
          puVar39[3] = puVar39[-5];
          lVar47 = lVar47 + -0x40;
          puVar16 = puVar39 + 8;
        } while (lVar47 != 0);
        puVar39 = puVar39 + -4;
      }
      uVar14 = puVar39[1];
      local_370 = (SPIRType *)uVar43;
      ((IVariant *)uVar43)->_vptr_IVariant = (_func_int **)*puVar39;
      *(undefined8 *)&((IVariant *)uVar43)->self = uVar14;
      ::std::__cxx11::string::operator=((string *)(uVar43 + 0x10),(string *)(puVar39 + 2));
      uVar12 = *(undefined4 *)((long)puVar39 + 0x34);
      uVar20 = *(uint32_t *)(puVar39 + 7);
      uVar13 = *(undefined4 *)((long)puVar39 + 0x3c);
      *(undefined4 *)&(local_368->super_IVariant)._vptr_IVariant = *(undefined4 *)(puVar39 + 6);
      *(undefined4 *)((long)&(local_368->super_IVariant)._vptr_IVariant + 4) = uVar12;
      (local_368->super_IVariant).self.id = uVar20;
      *(undefined4 *)&(local_368->super_IVariant).field_0xc = uVar13;
      ::std::
      __stable_sort_adaptive<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::__1>>
                (local_370,lVar45,puVar26,uVar46);
      uVar49 = uVar49 * 0x20 + 0x20 & 0xffffffffffffffc0;
      do {
        if (puVar40 != (undefined8 *)puVar40[-2]) {
          operator_delete((undefined8 *)puVar40[-2]);
        }
        puVar40 = puVar40 + 8;
        uVar49 = uVar49 - 0x40;
      } while (uVar49 != 0);
      goto LAB_002df8ef;
    }
LAB_002df799:
    ::std::
    __inplace_stable_sort<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::__1>>
              (uVar43,lVar45);
    puVar26 = (undefined8 *)0x0;
LAB_002df8ef:
    operator_delete(puVar26);
    if (local_248._8_8_ != 0) {
      local_2c0 = (SPIRType *)((long)(local_248._0_8_ + 0x20) + local_248._8_8_ * 0x40 + -0x20);
      local_2e0 = (SPIRVariable *)&local_3e0->plane_name_suffix;
      local_370 = (SPIRType *)&(local_3e0->super_CompilerGLSL).super_Compiler.interlocked_resources;
      local_2d8 = &(local_3e0->atomic_image_vars)._M_h;
      local_2d0 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&(local_3e0->super_CompilerGLSL).super_Compiler.ir.meta;
      local_270 = &local_3e0->buffer_aliases_discrete;
      local_278 = &local_3e0->buffer_arrays_discrete;
      pSVar41 = (SPIRType *)local_248._0_8_;
      do {
        pSVar22 = (SPIRVariable *)(pSVar41->super_IVariant)._vptr_IVariant;
        pSVar27 = Compiler::get_variable_data_type((Compiler *)local_3e0,pSVar22);
        local_3b4.id = (pSVar22->super_IVariant).self.id;
        local_368 = pSVar22;
        switch((int)(pSVar41->array).buffer_capacity) {
        case 0xf:
          pmVar28 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_2d0,&(pSVar27->super_IVariant).self);
          pSVar22 = local_368;
          pCVar48 = local_3e0;
          if ((pmVar28->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size != 0) {
            pp_Var5 = *(_func_int ***)&(pSVar41->super_IVariant).self;
            if (pp_Var5 == (_func_int **)0x0) {
              sVar3 = (pSVar27->array).super_VectorView<unsigned_int>.buffer_size;
              if (sVar3 == 0) {
                if (local_3e8->_M_string_length != 0) {
                  ::std::__cxx11::string::append((char *)local_3e8);
                }
                pSVar22 = local_368;
                pCVar48 = local_3e0;
                pSVar30 = Variant::get<spirv_cross::SPIRType>
                                    ((local_3e0->super_CompilerGLSL).super_Compiler.ir.ids.
                                     super_VectorView<spirv_cross::Variant>.ptr +
                                     *(uint *)&(local_368->super_IVariant).field_0xc);
                get_type_address_space_abi_cxx11_
                          (&local_320,pCVar48,pSVar30,(pSVar22->super_IVariant).self.id,true);
                puVar26 = (undefined8 *)::std::__cxx11::string::append((char *)&local_320);
                local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
                puVar35 = puVar26 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar26 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar35) {
                  local_340.field_2._M_allocated_capacity = *puVar35;
                  local_340.field_2._8_8_ = puVar26[3];
                }
                else {
                  local_340.field_2._M_allocated_capacity = *puVar35;
                  local_340._M_dataplus._M_p = (pointer)*puVar26;
                }
                local_340._M_string_length = puVar26[1];
                *puVar26 = puVar35;
                puVar26[1] = 0;
                *(undefined1 *)(puVar26 + 2) = 0;
                (*(local_3e0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (&local_300,local_3e0,pSVar27,0);
                uVar43 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_340._M_dataplus._M_p != &local_340.field_2) {
                  uVar43 = local_340.field_2._M_allocated_capacity;
                }
                uVar49 = (long)&(local_2f8->type).id + local_340._M_string_length;
                if ((ulong)uVar43 < uVar49) {
                  in_R9 = &local_2f0;
                  uVar43 = 0xf;
                  if (local_300 != in_R9) {
                    uVar43 = local_2f0._M_allocated_capacity;
                  }
                  if ((ulong)uVar43 < uVar49) goto LAB_002e19bb;
                  puVar26 = (undefined8 *)
                            ::std::__cxx11::string::replace
                                      ((ulong)&local_300,0,(char *)0x0,
                                       (ulong)local_340._M_dataplus._M_p);
                }
                else {
LAB_002e19bb:
                  puVar26 = (undefined8 *)
                            ::std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_300);
                }
                local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
                puVar35 = puVar26 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar26 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar35) {
                  local_360.field_2._M_allocated_capacity = *puVar35;
                  local_360.field_2._8_8_ = puVar26[3];
                }
                else {
                  local_360.field_2._M_allocated_capacity = *puVar35;
                  local_360._M_dataplus._M_p = (pointer)*puVar26;
                }
                local_360._M_string_length = puVar26[1];
                *puVar26 = puVar35;
                puVar26[1] = 0;
                *(undefined1 *)puVar35 = 0;
                puVar26 = (undefined8 *)::std::__cxx11::string::append((char *)&local_360);
                local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
                psVar34 = puVar26 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar26 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar34) {
                  local_3d8.field_2._M_allocated_capacity = *psVar34;
                  local_3d8.field_2._8_8_ = puVar26[3];
                }
                else {
                  local_3d8.field_2._M_allocated_capacity = *psVar34;
                  local_3d8._M_dataplus._M_p = (pointer)*puVar26;
                }
                local_3d8._M_string_length = puVar26[1];
                *puVar26 = psVar34;
                puVar26[1] = 0;
                *(undefined1 *)(puVar26 + 2) = 0;
                to_restrict(local_3e0,local_3b4.id,true);
                plVar29 = (long *)::std::__cxx11::string::append((char *)&local_3d8);
                local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
                psVar34 = (size_type *)(plVar29 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar29 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar34) {
                  local_408.field_2._M_allocated_capacity = *psVar34;
                  local_408.field_2._8_8_ = plVar29[3];
                }
                else {
                  local_408.field_2._M_allocated_capacity = *psVar34;
                  local_408._M_dataplus._M_p = (pointer)*plVar29;
                }
                local_408._M_string_length = plVar29[1];
                *plVar29 = (long)psVar34;
                plVar29[1] = 0;
                *(undefined1 *)(plVar29 + 2) = 0;
                uVar11._0_4_ = pSVar41->width;
                uVar11._4_4_ = pSVar41->vecsize;
                plVar29 = (long *)::std::__cxx11::string::_M_append((char *)&local_408,uVar11);
                local_3b0._0_8_ = local_3a0;
                pSVar22 = (SPIRVariable *)(plVar29 + 2);
                if ((SPIRVariable *)*plVar29 == pSVar22) {
                  local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
                  local_3a0._8_8_ = plVar29[3];
                }
                else {
                  local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
                  local_3b0._0_8_ = (SPIRVariable *)*plVar29;
                }
                local_3b0._8_8_ = plVar29[1];
                *plVar29 = (long)pSVar22;
                plVar29[1] = 0;
                *(undefined1 *)(plVar29 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
                if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
                  operator_delete((void *)local_3b0._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_408._M_dataplus._M_p != &local_408.field_2) {
                  operator_delete(local_408._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                  operator_delete(local_3d8._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_360._M_dataplus._M_p != &local_360.field_2) {
                  operator_delete(local_360._M_dataplus._M_p);
                }
                if (local_300 != &local_2f0) {
                  operator_delete(local_300);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_340._M_dataplus._M_p != &local_340.field_2) {
                  operator_delete(local_340._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_320._M_dataplus._M_p != &local_320.field_2) {
                  operator_delete(local_320._M_dataplus._M_p);
                }
                uVar50 = *(uint *)((long)&(pSVar41->array).buffer_capacity + 4);
                cVar19 = '\x01';
                if (9 < uVar50) {
                  uVar37 = uVar50;
                  cVar17 = '\x04';
                  do {
                    cVar19 = cVar17;
                    if (uVar37 < 100) {
                      cVar19 = cVar19 + -2;
                      goto LAB_002e1f78;
                    }
                    if (uVar37 < 1000) {
                      cVar19 = cVar19 + -1;
                      goto LAB_002e1f78;
                    }
                    if (uVar37 < 10000) goto LAB_002e1f78;
                    bVar18 = 99999 < uVar37;
                    uVar37 = uVar37 / 10000;
                    cVar17 = cVar19 + '\x04';
                  } while (bVar18);
                  cVar19 = cVar19 + '\x01';
                }
LAB_002e1f78:
                local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
                ::std::__cxx11::string::_M_construct((ulong)&local_3d8,cVar19);
                ::std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_3d8._M_dataplus._M_p,(uint)local_3d8._M_string_length,uVar50);
                puVar26 = (undefined8 *)
                          ::std::__cxx11::string::replace((ulong)&local_3d8,0,(char *)0x0,0x3771ea);
                local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
                psVar34 = puVar26 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar26 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar34) {
                  local_408.field_2._M_allocated_capacity = *psVar34;
                  local_408.field_2._8_8_ = puVar26[3];
                }
                else {
                  local_408.field_2._M_allocated_capacity = *psVar34;
                  local_408._M_dataplus._M_p = (pointer)*puVar26;
                }
                local_408._M_string_length = puVar26[1];
                *puVar26 = psVar34;
                puVar26[1] = 0;
                *(undefined1 *)(puVar26 + 2) = 0;
                plVar29 = (long *)::std::__cxx11::string::append((char *)&local_408);
                local_3b0._0_8_ = local_3a0;
                pSVar22 = (SPIRVariable *)(plVar29 + 2);
                if ((SPIRVariable *)*plVar29 == pSVar22) {
                  local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
                  local_3a0._8_8_ = plVar29[3];
                }
                else {
                  local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
                  local_3b0._0_8_ = (SPIRVariable *)*plVar29;
                }
                local_3b0._8_8_ = plVar29[1];
                *plVar29 = (long)pSVar22;
                plVar29[1] = 0;
                *(undefined1 *)(plVar29 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
                if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
                  operator_delete((void *)local_3b0._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_408._M_dataplus._M_p != &local_408.field_2) {
                  operator_delete(local_408._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                  operator_delete(local_3d8._M_dataplus._M_p);
                }
                cVar25 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                 *)local_370,&local_3b4.id);
                if (cVar25.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                    (__node_type *)0x0) {
                  ::std::__cxx11::string::append((char *)local_3e8);
                }
                ::std::__cxx11::string::append((char *)local_3e8);
              }
              else {
                if (sVar3 != 1) {
                  prVar32 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_3b0._0_8_ = local_3a0;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_3b0,"Arrays of arrays of buffers are not supported.",""
                            );
                  ::std::runtime_error::runtime_error(prVar32,(string *)local_3b0);
                  *(undefined ***)prVar32 = &PTR__runtime_error_003f8e68;
                  __cxa_throw(prVar32,&CompilerError::typeinfo,::std::runtime_error::~runtime_error)
                  ;
                }
                uVar20 = CompilerGLSL::to_array_size_literal(&local_3e0->super_CompilerGLSL,pSVar27)
                ;
                pCVar48 = local_3e0;
                if (uVar20 == 0) {
                  prVar32 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_3b0._0_8_ = local_3a0;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_3b0,
                             "Unsized arrays of buffers are not supported in MSL.","");
                  ::std::runtime_error::runtime_error(prVar32,(string *)local_3b0);
                  *(undefined ***)prVar32 = &PTR__runtime_error_003f8e68;
                  __cxa_throw(prVar32,&CompilerError::typeinfo,::std::runtime_error::~runtime_error)
                  ;
                }
                local_3e0->is_using_builtin_array = true;
                SmallVector<unsigned_int,_8UL>::reserve
                          (local_278,
                           (local_3e0->buffer_arrays_discrete).super_VectorView<unsigned_int>.
                           buffer_size + 1);
                sVar3 = (pCVar48->buffer_arrays_discrete).super_VectorView<unsigned_int>.buffer_size
                ;
                (pCVar48->buffer_arrays_discrete).super_VectorView<unsigned_int>.ptr[sVar3] =
                     local_3b4.id;
                (pCVar48->buffer_arrays_discrete).super_VectorView<unsigned_int>.buffer_size =
                     sVar3 + 1;
                uVar49 = 0;
                local_2c8 = (SPIRType *)CONCAT44(local_2c8._4_4_,uVar20);
                do {
                  if (local_3e8->_M_string_length != 0) {
                    ::std::__cxx11::string::append((char *)local_3e8);
                  }
                  pSVar22 = local_368;
                  pCVar48 = local_3e0;
                  pSVar30 = Variant::get<spirv_cross::SPIRType>
                                      ((local_3e0->super_CompilerGLSL).super_Compiler.ir.ids.
                                       super_VectorView<spirv_cross::Variant>.ptr +
                                       *(uint *)&(local_368->super_IVariant).field_0xc);
                  get_type_address_space_abi_cxx11_
                            (&local_268,pCVar48,pSVar30,(pSVar22->super_IVariant).self.id,true);
                  plVar29 = (long *)::std::__cxx11::string::append((char *)&local_268);
                  local_300 = &local_2f0;
                  paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(plVar29 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar29 == paVar36) {
                    local_2f0._M_allocated_capacity = paVar36->_M_allocated_capacity;
                    local_2f0._8_4_ = (undefined4)plVar29[3];
                    local_2f0._12_4_ = *(undefined4 *)((long)plVar29 + 0x1c);
                  }
                  else {
                    local_2f0._M_allocated_capacity = paVar36->_M_allocated_capacity;
                    local_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)*plVar29;
                  }
                  local_2f8 = (Parameter *)plVar29[1];
                  *plVar29 = (long)paVar36;
                  plVar29[1] = 0;
                  *(undefined1 *)(plVar29 + 2) = 0;
                  (*(local_3e0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                            (&local_298,local_3e0,pSVar27,0);
                  uVar43 = 0xf;
                  if (local_300 != &local_2f0) {
                    uVar43 = local_2f0._M_allocated_capacity;
                  }
                  uVar46 = (long)&(local_2f8->type).id + local_290;
                  if ((ulong)uVar43 < uVar46) {
                    in_R9 = &local_288;
                    uVar43 = 0xf;
                    if (local_298 != in_R9) {
                      uVar43 = local_288._M_allocated_capacity;
                    }
                    if ((ulong)uVar43 < uVar46) goto LAB_002e03f7;
                    puVar26 = (undefined8 *)
                              ::std::__cxx11::string::replace
                                        ((ulong)&local_298,0,(char *)0x0,(ulong)local_300);
                  }
                  else {
LAB_002e03f7:
                    puVar26 = (undefined8 *)
                              ::std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_298)
                    ;
                  }
                  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
                  puVar35 = puVar26 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar26 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar35) {
                    local_320.field_2._M_allocated_capacity = *puVar35;
                    local_320.field_2._8_8_ = puVar26[3];
                  }
                  else {
                    local_320.field_2._M_allocated_capacity = *puVar35;
                    local_320._M_dataplus._M_p = (pointer)*puVar26;
                  }
                  local_320._M_string_length = puVar26[1];
                  *puVar26 = puVar35;
                  puVar26[1] = 0;
                  *(undefined1 *)puVar35 = 0;
                  puVar26 = (undefined8 *)::std::__cxx11::string::append((char *)&local_320);
                  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
                  puVar35 = puVar26 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar26 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar35) {
                    local_340.field_2._M_allocated_capacity = *puVar35;
                    local_340.field_2._8_8_ = puVar26[3];
                  }
                  else {
                    local_340.field_2._M_allocated_capacity = *puVar35;
                    local_340._M_dataplus._M_p = (pointer)*puVar26;
                  }
                  local_340._M_string_length = puVar26[1];
                  *puVar26 = puVar35;
                  puVar26[1] = 0;
                  *(undefined1 *)(puVar26 + 2) = 0;
                  to_restrict(local_3e0,local_3b4.id,true);
                  puVar26 = (undefined8 *)::std::__cxx11::string::append((char *)&local_340);
                  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
                  puVar35 = puVar26 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar26 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar35) {
                    local_360.field_2._M_allocated_capacity = *puVar35;
                    local_360.field_2._8_8_ = puVar26[3];
                  }
                  else {
                    local_360.field_2._M_allocated_capacity = *puVar35;
                    local_360._M_dataplus._M_p = (pointer)*puVar26;
                  }
                  local_360._M_string_length = puVar26[1];
                  *puVar26 = puVar35;
                  puVar26[1] = 0;
                  *(undefined1 *)(puVar26 + 2) = 0;
                  uVar7._0_4_ = pSVar41->width;
                  uVar7._4_4_ = pSVar41->vecsize;
                  puVar26 = (undefined8 *)
                            ::std::__cxx11::string::_M_append((char *)&local_360,uVar7);
                  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
                  psVar34 = puVar26 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar26 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar34) {
                    local_3d8.field_2._M_allocated_capacity = *psVar34;
                    local_3d8.field_2._8_8_ = puVar26[3];
                  }
                  else {
                    local_3d8.field_2._M_allocated_capacity = *psVar34;
                    local_3d8._M_dataplus._M_p = (pointer)*puVar26;
                  }
                  local_3d8._M_string_length = puVar26[1];
                  *puVar26 = psVar34;
                  puVar26[1] = 0;
                  *(undefined1 *)(puVar26 + 2) = 0;
                  plVar29 = (long *)::std::__cxx11::string::append((char *)&local_3d8);
                  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
                  puVar35 = (ulong *)(plVar29 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar29 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar35) {
                    local_408.field_2._M_allocated_capacity = *puVar35;
                    local_408.field_2._8_8_ = plVar29[3];
                  }
                  else {
                    local_408.field_2._M_allocated_capacity = *puVar35;
                    local_408._M_dataplus._M_p = (pointer)*plVar29;
                  }
                  local_408._M_string_length = plVar29[1];
                  *plVar29 = (long)puVar35;
                  plVar29[1] = 0;
                  *(undefined1 *)(plVar29 + 2) = 0;
                  cVar19 = '\x01';
                  uVar50 = (uint)uVar49;
                  if (9 < uVar50) {
                    cVar17 = '\x04';
                    do {
                      cVar19 = cVar17;
                      uVar37 = (uint)uVar49;
                      if (uVar37 < 100) {
                        cVar19 = cVar19 + -2;
                        goto LAB_002e064a;
                      }
                      if (uVar37 < 1000) {
                        cVar19 = cVar19 + -1;
                        goto LAB_002e064a;
                      }
                      if (uVar37 < 10000) goto LAB_002e064a;
                      uVar49 = uVar49 / 10000;
                      cVar17 = cVar19 + '\x04';
                    } while (99999 < uVar37);
                    cVar19 = cVar19 + '\x01';
                  }
LAB_002e064a:
                  local_2b8 = &local_2a8;
                  ::std::__cxx11::string::_M_construct((ulong)&local_2b8,cVar19);
                  ::std::__detail::__to_chars_10_impl<unsigned_int>
                            (local_2b8->_M_local_buf,local_2b0,uVar50);
                  uVar43 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_408._M_dataplus._M_p != &local_408.field_2) {
                    uVar43 = local_408.field_2._M_allocated_capacity;
                  }
                  uVar49 = CONCAT44(uStack_2ac,local_2b0) + local_408._M_string_length;
                  if ((ulong)uVar43 < uVar49) {
                    in_R9 = &local_2a8;
                    uVar43 = 0xf;
                    if (local_2b8 != in_R9) {
                      uVar43 = local_2a8._M_allocated_capacity;
                    }
                    if ((ulong)uVar43 < uVar49) goto LAB_002e06d7;
                    plVar29 = (long *)::std::__cxx11::string::replace
                                                ((ulong)&local_2b8,0,(char *)0x0,
                                                 (ulong)local_408._M_dataplus._M_p);
                  }
                  else {
LAB_002e06d7:
                    plVar29 = (long *)::std::__cxx11::string::_M_append
                                                ((char *)&local_408,(ulong)local_2b8);
                  }
                  local_3b0._0_8_ = local_3a0;
                  pSVar22 = (SPIRVariable *)(plVar29 + 2);
                  if ((SPIRVariable *)*plVar29 == pSVar22) {
                    local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
                    local_3a0._8_8_ = plVar29[3];
                  }
                  else {
                    local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
                    local_3b0._0_8_ = (SPIRVariable *)*plVar29;
                  }
                  local_3b0._8_8_ = plVar29[1];
                  *plVar29 = (long)pSVar22;
                  plVar29[1] = 0;
                  *(undefined1 *)&(pSVar22->super_IVariant)._vptr_IVariant = 0;
                  ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
                  if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
                    operator_delete((void *)local_3b0._0_8_);
                  }
                  if (local_2b8 != &local_2a8) {
                    operator_delete(local_2b8);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_408._M_dataplus._M_p != &local_408.field_2) {
                    operator_delete(local_408._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                    operator_delete(local_3d8._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_360._M_dataplus._M_p != &local_360.field_2) {
                    operator_delete(local_360._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_340._M_dataplus._M_p != &local_340.field_2) {
                    operator_delete(local_340._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_320._M_dataplus._M_p != &local_320.field_2) {
                    operator_delete(local_320._M_dataplus._M_p);
                  }
                  if (local_298 != &local_288) {
                    operator_delete(local_298);
                  }
                  if (local_300 != &local_2f0) {
                    operator_delete(local_300);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_268._M_dataplus._M_p != &local_268.field_2) {
                    operator_delete(local_268._M_dataplus._M_p);
                  }
                  uVar37 = *(int *)((long)&(pSVar41->array).buffer_capacity + 4) + uVar50;
                  cVar19 = '\x01';
                  if (9 < uVar37) {
                    uVar33 = uVar37;
                    cVar17 = '\x04';
                    do {
                      cVar19 = cVar17;
                      if (uVar33 < 100) {
                        cVar19 = cVar19 + -2;
                        goto LAB_002e0893;
                      }
                      if (uVar33 < 1000) {
                        cVar19 = cVar19 + -1;
                        goto LAB_002e0893;
                      }
                      if (uVar33 < 10000) goto LAB_002e0893;
                      bVar18 = 99999 < uVar33;
                      uVar33 = uVar33 / 10000;
                      cVar17 = cVar19 + '\x04';
                    } while (bVar18);
                    cVar19 = cVar19 + '\x01';
                  }
LAB_002e0893:
                  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
                  ::std::__cxx11::string::_M_construct((ulong)&local_3d8,cVar19);
                  ::std::__detail::__to_chars_10_impl<unsigned_int>
                            (local_3d8._M_dataplus._M_p,(uint)local_3d8._M_string_length,uVar37);
                  plVar29 = (long *)::std::__cxx11::string::replace
                                              ((ulong)&local_3d8,0,(char *)0x0,0x3771ea);
                  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
                  psVar34 = (size_type *)(plVar29 + 2);
                  uVar37 = (uint)local_2c8;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar29 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar34) {
                    local_408.field_2._M_allocated_capacity = *psVar34;
                    local_408.field_2._8_8_ = plVar29[3];
                  }
                  else {
                    local_408.field_2._M_allocated_capacity = *psVar34;
                    local_408._M_dataplus._M_p = (pointer)*plVar29;
                  }
                  local_408._M_string_length = plVar29[1];
                  *plVar29 = (long)psVar34;
                  plVar29[1] = 0;
                  *(undefined1 *)(plVar29 + 2) = 0;
                  plVar29 = (long *)::std::__cxx11::string::append((char *)&local_408);
                  local_3b0._0_8_ = local_3a0;
                  pSVar22 = (SPIRVariable *)(plVar29 + 2);
                  if ((SPIRVariable *)*plVar29 == pSVar22) {
                    local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
                    local_3a0._8_8_ = plVar29[3];
                  }
                  else {
                    local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
                    local_3b0._0_8_ = (SPIRVariable *)*plVar29;
                  }
                  local_3b0._8_8_ = plVar29[1];
                  *plVar29 = (long)pSVar22;
                  plVar29[1] = 0;
                  *(undefined1 *)(plVar29 + 2) = 0;
                  ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
                  if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
                    operator_delete((void *)local_3b0._0_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_408._M_dataplus._M_p != &local_408.field_2) {
                    operator_delete(local_408._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                    operator_delete(local_3d8._M_dataplus._M_p);
                  }
                  cVar25 = ::std::
                           _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                   *)local_370,&local_3b4.id);
                  if (cVar25.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                      (__node_type *)0x0) {
                    ::std::__cxx11::string::append((char *)local_3e8);
                  }
                  ::std::__cxx11::string::append((char *)local_3e8);
                  uVar49 = (ulong)(uVar50 + 1);
                } while (uVar50 + 1 != uVar37);
                local_3e0->is_using_builtin_array = false;
              }
            }
            else {
              pp_Var31 = (pSVar41->super_IVariant)._vptr_IVariant;
              if (pp_Var31 == pp_Var5) {
                uVar20 = Compiler::get_decoration
                                   ((Compiler *)local_3e0,local_3b4,DecorationDescriptorSet);
                local_408._M_dataplus._M_p._0_4_ = uVar20;
                uVar20 = Compiler::get_decoration((Compiler *)pCVar48,local_3b4,DecorationBinding);
                local_3d8._M_dataplus._M_p._0_4_ = uVar20;
                join<char_const(&)[18],unsigned_int,char_const(&)[8],unsigned_int>
                          ((string *)local_3b0,(spirv_cross *)"spvBufferAliasSet",
                           (char (*) [18])&local_408,(uint *)"Binding",(char (*) [8])&local_3d8,
                           (uint *)&in_R9->_M_allocated_capacity);
                if (local_3e8->_M_string_length != 0) {
                  ::std::__cxx11::string::append((char *)local_3e8);
                }
                pCVar48 = local_3e0;
                pSVar27 = Variant::get<spirv_cross::SPIRType>
                                    ((local_3e0->super_CompilerGLSL).super_Compiler.ir.ids.
                                     super_VectorView<spirv_cross::Variant>.ptr +
                                     *(uint *)&(pSVar22->super_IVariant).field_0xc);
                get_type_address_space_abi_cxx11_
                          (&local_360,pCVar48,pSVar27,(pSVar22->super_IVariant).self.id,true);
                plVar29 = (long *)::std::__cxx11::string::append((char *)&local_360);
                local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
                psVar34 = (size_type *)(plVar29 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar29 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar34) {
                  local_3d8.field_2._M_allocated_capacity = *psVar34;
                  local_3d8.field_2._8_8_ = plVar29[3];
                }
                else {
                  local_3d8.field_2._M_allocated_capacity = *psVar34;
                  local_3d8._M_dataplus._M_p = (pointer)*plVar29;
                }
                local_3d8._M_string_length = plVar29[1];
                *plVar29 = (long)psVar34;
                plVar29[1] = 0;
                *(undefined1 *)(plVar29 + 2) = 0;
                plVar29 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)&local_3d8,local_3b0._0_8_);
                local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
                psVar34 = (size_type *)(plVar29 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar29 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar34) {
                  local_408.field_2._M_allocated_capacity = *psVar34;
                  local_408.field_2._8_8_ = plVar29[3];
                }
                else {
                  local_408.field_2._M_allocated_capacity = *psVar34;
                  local_408._M_dataplus._M_p = (pointer)*plVar29;
                }
                local_408._M_string_length = plVar29[1];
                *plVar29 = (long)psVar34;
                plVar29[1] = 0;
                *(undefined1 *)(plVar29 + 2) = 0;
                ::std::__cxx11::string::_M_append
                          ((char *)local_3e8,(ulong)local_408._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_408._M_dataplus._M_p != &local_408.field_2) {
                  operator_delete(local_408._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                  operator_delete(local_3d8._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_360._M_dataplus._M_p != &local_360.field_2) {
                  operator_delete(local_360._M_dataplus._M_p);
                }
                uVar50 = *(uint *)((long)&(pSVar41->array).buffer_capacity + 4);
                cVar19 = '\x01';
                if (9 < uVar50) {
                  uVar37 = uVar50;
                  cVar17 = '\x04';
                  do {
                    cVar19 = cVar17;
                    if (uVar37 < 100) {
                      cVar19 = cVar19 + -2;
                      goto LAB_002e1da1;
                    }
                    if (uVar37 < 1000) {
                      cVar19 = cVar19 + -1;
                      goto LAB_002e1da1;
                    }
                    if (uVar37 < 10000) goto LAB_002e1da1;
                    bVar18 = 99999 < uVar37;
                    uVar37 = uVar37 / 10000;
                    cVar17 = cVar19 + '\x04';
                  } while (bVar18);
                  cVar19 = cVar19 + '\x01';
                }
LAB_002e1da1:
                local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
                ::std::__cxx11::string::_M_construct((ulong)&local_360,cVar19);
                ::std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_360._M_dataplus._M_p,(uint)local_360._M_string_length,uVar50);
                puVar26 = (undefined8 *)
                          ::std::__cxx11::string::replace((ulong)&local_360,0,(char *)0x0,0x3771ea);
                local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
                psVar34 = puVar26 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar26 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar34) {
                  local_3d8.field_2._M_allocated_capacity = *psVar34;
                  local_3d8.field_2._8_8_ = puVar26[3];
                }
                else {
                  local_3d8.field_2._M_allocated_capacity = *psVar34;
                  local_3d8._M_dataplus._M_p = (pointer)*puVar26;
                }
                local_3d8._M_string_length = puVar26[1];
                *puVar26 = psVar34;
                puVar26[1] = 0;
                *(undefined1 *)(puVar26 + 2) = 0;
                puVar26 = (undefined8 *)::std::__cxx11::string::append((char *)&local_3d8);
                local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
                psVar34 = puVar26 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar26 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar34) {
                  local_408.field_2._M_allocated_capacity = *psVar34;
                  local_408.field_2._8_8_ = puVar26[3];
                }
                else {
                  local_408.field_2._M_allocated_capacity = *psVar34;
                  local_408._M_dataplus._M_p = (pointer)*puVar26;
                }
                local_408._M_string_length = puVar26[1];
                *puVar26 = psVar34;
                puVar26[1] = 0;
                *(undefined1 *)(puVar26 + 2) = 0;
                ::std::__cxx11::string::_M_append
                          ((char *)local_3e8,(ulong)local_408._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_408._M_dataplus._M_p != &local_408.field_2) {
                  operator_delete(local_408._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                  operator_delete(local_3d8._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_360._M_dataplus._M_p != &local_360.field_2) {
                  operator_delete(local_360._M_dataplus._M_p);
                }
                cVar25 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                 *)local_370,&local_3b4.id);
                if (cVar25.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                    (__node_type *)0x0) {
                  ::std::__cxx11::string::append((char *)local_3e8);
                }
                ::std::__cxx11::string::append((char *)local_3e8);
                if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
                  operator_delete((void *)local_3b0._0_8_);
                }
                pp_Var31 = (pSVar41->super_IVariant)._vptr_IVariant;
              }
              pCVar48 = local_3e0;
              uVar50 = *(uint *)(pp_Var31 + 1);
              SmallVector<unsigned_int,_8UL>::reserve
                        (local_270,
                         (local_3e0->buffer_aliases_discrete).super_VectorView<unsigned_int>.
                         buffer_size + 1);
              sVar3 = (pCVar48->buffer_aliases_discrete).super_VectorView<unsigned_int>.buffer_size;
              (pCVar48->buffer_aliases_discrete).super_VectorView<unsigned_int>.ptr[sVar3] = uVar50;
              (pCVar48->buffer_aliases_discrete).super_VectorView<unsigned_int>.buffer_size =
                   sVar3 + 1;
            }
          }
          break;
        case 0x10:
          if (local_3e8->_M_string_length != 0) {
            ::std::__cxx11::string::append((char *)local_3e8);
          }
          pSVar30 = Variant::get<spirv_cross::SPIRType>
                              ((local_3e0->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)&(local_368->super_IVariant).field_0xc);
          if (((*(int *)&(pSVar30->super_IVariant).field_0xc == 0x10) &&
              ((pSVar30->image).dim == DimSubpassData)) &&
             ((local_3e0->msl_options).use_framebuffer_fetch_subpasses != false)) {
            if (((local_3e0->msl_options).platform == macOS) &&
               ((local_3e0->msl_options).msl_version < 0x4f4c)) {
              prVar32 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_3b0._0_8_ = local_3a0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3b0,
                         "Framebuffer fetch on Mac is not supported before MSL 2.3.","");
              ::std::runtime_error::runtime_error(prVar32,(string *)local_3b0);
              *(undefined ***)prVar32 = &PTR__runtime_error_003f8e68;
              __cxa_throw(prVar32,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            (*(local_3e0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                      (&local_3d8,local_3e0,pSVar27,(ulong)local_3b4.id);
            plVar29 = (long *)::std::__cxx11::string::append((char *)&local_3d8);
            local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
            psVar34 = (size_type *)(plVar29 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar29 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar34) {
              local_408.field_2._M_allocated_capacity = *psVar34;
              local_408.field_2._8_8_ = plVar29[3];
            }
            else {
              local_408.field_2._M_allocated_capacity = *psVar34;
              local_408._M_dataplus._M_p = (pointer)*plVar29;
            }
            local_408._M_string_length = plVar29[1];
            *plVar29 = (long)psVar34;
            plVar29[1] = 0;
            *(undefined1 *)(plVar29 + 2) = 0;
            uVar10._0_4_ = pSVar41->width;
            uVar10._4_4_ = pSVar41->vecsize;
            plVar29 = (long *)::std::__cxx11::string::_M_append((char *)&local_408,uVar10);
            local_3b0._0_8_ = local_3a0;
            pSVar22 = (SPIRVariable *)(plVar29 + 2);
            if ((SPIRVariable *)*plVar29 == pSVar22) {
              local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3a0._8_8_ = plVar29[3];
            }
            else {
              local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3b0._0_8_ = (SPIRVariable *)*plVar29;
            }
            local_3b0._8_8_ = plVar29[1];
            *plVar29 = (long)pSVar22;
            plVar29[1] = 0;
            *(undefined1 *)(plVar29 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
            if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
              operator_delete((void *)local_3b0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) {
              operator_delete(local_408._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
              operator_delete(local_3d8._M_dataplus._M_p);
            }
            uVar50 = *(uint *)((long)&(pSVar41->array).buffer_capacity + 4);
            cVar19 = '\x01';
            if (9 < uVar50) {
              uVar37 = uVar50;
              cVar17 = '\x04';
              do {
                cVar19 = cVar17;
                if (uVar37 < 100) {
                  cVar19 = cVar19 + -2;
                  goto LAB_002e19cf;
                }
                if (uVar37 < 1000) {
                  cVar19 = cVar19 + -1;
                  goto LAB_002e19cf;
                }
                if (uVar37 < 10000) goto LAB_002e19cf;
                bVar18 = 99999 < uVar37;
                uVar37 = uVar37 / 10000;
                cVar17 = cVar19 + '\x04';
              } while (bVar18);
              cVar19 = cVar19 + '\x01';
            }
LAB_002e19cf:
            local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
            ::std::__cxx11::string::_M_construct((ulong)&local_3d8,cVar19);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_3d8._M_dataplus._M_p,(uint)local_3d8._M_string_length,uVar50);
            puVar26 = (undefined8 *)
                      ::std::__cxx11::string::replace((ulong)&local_3d8,0,(char *)0x0,0x3770b3);
            local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
            psVar34 = puVar26 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar26 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar34) {
              local_408.field_2._M_allocated_capacity = *psVar34;
              local_408.field_2._8_8_ = puVar26[3];
            }
            else {
              local_408.field_2._M_allocated_capacity = *psVar34;
              local_408._M_dataplus._M_p = (pointer)*puVar26;
            }
            local_408._M_string_length = puVar26[1];
            *puVar26 = psVar34;
            puVar26[1] = 0;
            *(undefined1 *)(puVar26 + 2) = 0;
            plVar29 = (long *)::std::__cxx11::string::append((char *)&local_408);
            local_3b0._0_8_ = local_3a0;
            pSVar22 = (SPIRVariable *)(plVar29 + 2);
            if ((SPIRVariable *)*plVar29 == pSVar22) {
              local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3a0._8_8_ = plVar29[3];
            }
            else {
              local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3b0._0_8_ = (SPIRVariable *)*plVar29;
            }
            local_3b0._8_8_ = plVar29[1];
            *plVar29 = (long)pSVar22;
            plVar29[1] = 0;
            *(undefined1 *)(plVar29 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
            if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
              operator_delete((void *)local_3b0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) {
              operator_delete(local_408._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
              operator_delete(local_3d8._M_dataplus._M_p);
            }
          }
          else {
            (*(local_3e0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                      (&local_3d8,local_3e0,pSVar27,(ulong)local_3b4.id);
            plVar29 = (long *)::std::__cxx11::string::append((char *)&local_3d8);
            local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
            psVar34 = (size_type *)(plVar29 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar29 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar34) {
              local_408.field_2._M_allocated_capacity = *psVar34;
              local_408.field_2._8_8_ = plVar29[3];
            }
            else {
              local_408.field_2._M_allocated_capacity = *psVar34;
              local_408._M_dataplus._M_p = (pointer)*plVar29;
            }
            local_408._M_string_length = plVar29[1];
            *plVar29 = (long)psVar34;
            plVar29[1] = 0;
            *(undefined1 *)(plVar29 + 2) = 0;
            uVar6._0_4_ = pSVar41->width;
            uVar6._4_4_ = pSVar41->vecsize;
            plVar29 = (long *)::std::__cxx11::string::_M_append((char *)&local_408,uVar6);
            local_3b0._0_8_ = local_3a0;
            pSVar22 = (SPIRVariable *)(plVar29 + 2);
            if ((SPIRVariable *)*plVar29 == pSVar22) {
              local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3a0._8_8_ = plVar29[3];
            }
            else {
              local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3b0._0_8_ = (SPIRVariable *)*plVar29;
            }
            local_3b0._8_8_ = plVar29[1];
            *plVar29 = (long)pSVar22;
            plVar29[1] = 0;
            *(undefined1 *)(plVar29 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
            if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
              operator_delete((void *)local_3b0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) {
              operator_delete(local_408._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
              operator_delete(local_3d8._M_dataplus._M_p);
            }
            if (*(int *)(pSVar41->array).stack_storage.aligned_char != 0) {
              join<std::__cxx11::string&,unsigned_int&>
                        ((string *)local_3b0,(spirv_cross *)local_2e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &(pSVar41->array).stack_storage,(uint *)pSVar22);
              ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
              if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
                operator_delete((void *)local_3b0._0_8_);
              }
            }
            uVar50 = *(uint *)((long)&(pSVar41->array).buffer_capacity + 4);
            cVar19 = '\x01';
            if (9 < uVar50) {
              uVar37 = uVar50;
              cVar17 = '\x04';
              do {
                cVar19 = cVar17;
                if (uVar37 < 100) {
                  cVar19 = cVar19 + -2;
                  goto LAB_002e11f2;
                }
                if (uVar37 < 1000) {
                  cVar19 = cVar19 + -1;
                  goto LAB_002e11f2;
                }
                if (uVar37 < 10000) goto LAB_002e11f2;
                bVar18 = 99999 < uVar37;
                uVar37 = uVar37 / 10000;
                cVar17 = cVar19 + '\x04';
              } while (bVar18);
              cVar19 = cVar19 + '\x01';
            }
LAB_002e11f2:
            local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
            ::std::__cxx11::string::_M_construct((ulong)&local_3d8,cVar19);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_3d8._M_dataplus._M_p,(uint)local_3d8._M_string_length,uVar50);
            puVar26 = (undefined8 *)
                      ::std::__cxx11::string::replace((ulong)&local_3d8,0,(char *)0x0,0x3772c1);
            local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
            psVar34 = puVar26 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar26 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar34) {
              local_408.field_2._M_allocated_capacity = *psVar34;
              local_408.field_2._8_8_ = puVar26[3];
            }
            else {
              local_408.field_2._M_allocated_capacity = *psVar34;
              local_408._M_dataplus._M_p = (pointer)*puVar26;
            }
            local_408._M_string_length = puVar26[1];
            *puVar26 = psVar34;
            puVar26[1] = 0;
            *(undefined1 *)(puVar26 + 2) = 0;
            plVar29 = (long *)::std::__cxx11::string::append((char *)&local_408);
            local_3b0._0_8_ = local_3a0;
            pSVar22 = (SPIRVariable *)(plVar29 + 2);
            if ((SPIRVariable *)*plVar29 == pSVar22) {
              local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3a0._8_8_ = plVar29[3];
            }
            else {
              local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3b0._0_8_ = (SPIRVariable *)*plVar29;
            }
            local_3b0._8_8_ = plVar29[1];
            *plVar29 = (long)pSVar22;
            plVar29[1] = 0;
            *(undefined1 *)(plVar29 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
            if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
              operator_delete((void *)local_3b0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) {
              operator_delete(local_408._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
              operator_delete(local_3d8._M_dataplus._M_p);
            }
            cVar25 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)local_370,&local_3b4.id);
            if (cVar25.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)
            {
              ::std::__cxx11::string::append((char *)local_3e8);
            }
            ::std::__cxx11::string::append((char *)local_3e8);
          }
          local_3b0._0_4_ = (local_368->super_IVariant).self.id;
          cVar25 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(local_2d8,(key_type *)local_3b0);
          pCVar48 = local_3e0;
          if (cVar25.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
            pSVar27 = Variant::get<spirv_cross::SPIRType>
                                ((local_3e0->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 (pSVar30->image).type.id);
            (*(pCVar48->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_408,pCVar48,pSVar27,0);
            plVar29 = (long *)::std::__cxx11::string::replace
                                        ((ulong)&local_408,0,(char *)0x0,0x377307);
            local_3b0._0_8_ = local_3a0;
            pSVar22 = (SPIRVariable *)(plVar29 + 2);
            if ((SPIRVariable *)*plVar29 == pSVar22) {
              local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3a0._8_8_ = plVar29[3];
            }
            else {
              local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3b0._0_8_ = (SPIRVariable *)*plVar29;
            }
            local_3b0._8_8_ = plVar29[1];
            *plVar29 = (long)pSVar22;
            plVar29[1] = 0;
            *(undefined1 *)(plVar29 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
            if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
              operator_delete((void *)local_3b0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) {
              operator_delete(local_408._M_dataplus._M_p);
            }
            ::std::operator+(&local_408,"* ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &pSVar41->width);
            plVar29 = (long *)::std::__cxx11::string::append((char *)&local_408);
            local_3b0._0_8_ = local_3a0;
            pSVar22 = (SPIRVariable *)(plVar29 + 2);
            if ((SPIRVariable *)*plVar29 == pSVar22) {
              local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3a0._8_8_ = plVar29[3];
            }
            else {
              local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3b0._0_8_ = (SPIRVariable *)*plVar29;
            }
            local_3b0._8_8_ = plVar29[1];
            *plVar29 = (long)pSVar22;
            plVar29[1] = 0;
            *(undefined1 *)(plVar29 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
            if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
              operator_delete((void *)local_3b0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) {
              operator_delete(local_408._M_dataplus._M_p);
            }
            uVar50 = *(uint *)((pSVar41->array).stack_storage.aligned_char + 4);
            cVar19 = '\x01';
            if (9 < uVar50) {
              uVar37 = uVar50;
              cVar17 = '\x04';
              do {
                cVar19 = cVar17;
                if (uVar37 < 100) {
                  cVar19 = cVar19 + -2;
                  goto LAB_002e1687;
                }
                if (uVar37 < 1000) {
                  cVar19 = cVar19 + -1;
                  goto LAB_002e1687;
                }
                if (uVar37 < 10000) goto LAB_002e1687;
                bVar18 = 99999 < uVar37;
                uVar37 = uVar37 / 10000;
                cVar17 = cVar19 + '\x04';
              } while (bVar18);
              cVar19 = cVar19 + '\x01';
            }
LAB_002e1687:
            local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
            ::std::__cxx11::string::_M_construct((ulong)&local_3d8,cVar19);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_3d8._M_dataplus._M_p,(uint)local_3d8._M_string_length,uVar50);
            puVar26 = (undefined8 *)
                      ::std::__cxx11::string::replace((ulong)&local_3d8,0,(char *)0x0,0x3771ea);
            local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
            psVar34 = puVar26 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar26 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar34) {
              local_408.field_2._M_allocated_capacity = *psVar34;
              local_408.field_2._8_8_ = puVar26[3];
            }
            else {
              local_408.field_2._M_allocated_capacity = *psVar34;
              local_408._M_dataplus._M_p = (pointer)*puVar26;
            }
            local_408._M_string_length = puVar26[1];
            *puVar26 = psVar34;
            puVar26[1] = 0;
            *(undefined1 *)(puVar26 + 2) = 0;
            plVar29 = (long *)::std::__cxx11::string::append((char *)&local_408);
            local_3b0._0_8_ = local_3a0;
            pSVar22 = (SPIRVariable *)(plVar29 + 2);
            if ((SPIRVariable *)*plVar29 == pSVar22) {
              local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3a0._8_8_ = plVar29[3];
            }
            else {
              local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3b0._0_8_ = (SPIRVariable *)*plVar29;
            }
            local_3b0._8_8_ = plVar29[1];
            *plVar29 = (long)pSVar22;
            plVar29[1] = 0;
            *(undefined1 *)(plVar29 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
            if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
              operator_delete((void *)local_3b0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) {
              operator_delete(local_408._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
              operator_delete(local_3d8._M_dataplus._M_p);
            }
            cVar25 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)local_370,&local_3b4.id);
            if (cVar25.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)
            {
              ::std::__cxx11::string::append((char *)local_3e8);
            }
            ::std::__cxx11::string::append((char *)local_3e8);
          }
          break;
        default:
          if (local_3e8->_M_string_length != 0) {
            ::std::__cxx11::string::append((char *)local_3e8);
          }
          pCVar48 = local_3e0;
          if (pSVar27->pointer == false) {
            pSVar30 = Variant::get<spirv_cross::SPIRType>
                                ((local_3e0->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 *(uint *)&(local_368->super_IVariant).field_0xc);
            get_type_address_space_abi_cxx11_(&local_340,pCVar48,pSVar30,local_3b4.id,false);
            puVar26 = (undefined8 *)::std::__cxx11::string::append((char *)&local_340);
            local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
            puVar35 = puVar26 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar26 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar35) {
              local_360.field_2._M_allocated_capacity = *puVar35;
              local_360.field_2._8_8_ = puVar26[3];
            }
            else {
              local_360.field_2._M_allocated_capacity = *puVar35;
              local_360._M_dataplus._M_p = (pointer)*puVar26;
            }
            local_360._M_string_length = puVar26[1];
            *puVar26 = puVar35;
            puVar26[1] = 0;
            *(undefined1 *)(puVar26 + 2) = 0;
            (*(local_3e0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_320,local_3e0,pSVar27,(ulong)local_3b4.id);
            uVar43 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != &local_360.field_2) {
              uVar43 = local_360.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar43 < local_320._M_string_length + local_360._M_string_length) {
              in_R9 = &local_320.field_2;
              uVar43 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._M_dataplus._M_p != in_R9) {
                uVar43 = local_320.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar43 < local_320._M_string_length + local_360._M_string_length)
              goto LAB_002e0b21;
              puVar26 = (undefined8 *)
                        ::std::__cxx11::string::replace
                                  ((ulong)&local_320,0,(char *)0x0,(ulong)local_360._M_dataplus._M_p
                                  );
            }
            else {
LAB_002e0b21:
              puVar26 = (undefined8 *)
                        ::std::__cxx11::string::_M_append
                                  ((char *)&local_360,(ulong)local_320._M_dataplus._M_p);
            }
            local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
            psVar34 = puVar26 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar26 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar34) {
              local_3d8.field_2._M_allocated_capacity = *psVar34;
              local_3d8.field_2._8_8_ = puVar26[3];
            }
            else {
              local_3d8.field_2._M_allocated_capacity = *psVar34;
              local_3d8._M_dataplus._M_p = (pointer)*puVar26;
            }
            local_3d8._M_string_length = puVar26[1];
            *puVar26 = psVar34;
            puVar26[1] = 0;
            *(undefined1 *)psVar34 = 0;
            puVar26 = (undefined8 *)::std::__cxx11::string::append((char *)&local_3d8);
            local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
            psVar34 = puVar26 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar26 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar34) {
              local_408.field_2._M_allocated_capacity = *psVar34;
              local_408.field_2._8_8_ = puVar26[3];
            }
            else {
              local_408.field_2._M_allocated_capacity = *psVar34;
              local_408._M_dataplus._M_p = (pointer)*puVar26;
            }
            local_408._M_string_length = puVar26[1];
            *puVar26 = psVar34;
            puVar26[1] = 0;
            *(undefined1 *)(puVar26 + 2) = 0;
            uVar9._0_4_ = pSVar41->width;
            uVar9._4_4_ = pSVar41->vecsize;
            plVar29 = (long *)::std::__cxx11::string::_M_append((char *)&local_408,uVar9);
            local_3b0._0_8_ = local_3a0;
            pSVar22 = (SPIRVariable *)(plVar29 + 2);
            if ((SPIRVariable *)*plVar29 == pSVar22) {
              local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3a0._8_8_ = plVar29[3];
            }
            else {
              local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3b0._0_8_ = (SPIRVariable *)*plVar29;
            }
            local_3b0._8_8_ = plVar29[1];
            *plVar29 = (long)pSVar22;
            plVar29[1] = 0;
            *(undefined1 *)(plVar29 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
            if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
              operator_delete((void *)local_3b0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) {
              operator_delete(local_408._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
              operator_delete(local_3d8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320._M_dataplus._M_p != &local_320.field_2) {
              operator_delete(local_320._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != &local_360.field_2) {
              operator_delete(local_360._M_dataplus._M_p);
            }
            psVar15 = &local_340;
            _Var44._M_p = local_340._M_dataplus._M_p;
          }
          else {
            (*(local_3e0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_3d8,local_3e0,pSVar27,(ulong)local_3b4.id);
            plVar29 = (long *)::std::__cxx11::string::append((char *)&local_3d8);
            local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
            psVar34 = (size_type *)(plVar29 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar29 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar34) {
              local_408.field_2._M_allocated_capacity = *psVar34;
              local_408.field_2._8_8_ = plVar29[3];
            }
            else {
              local_408.field_2._M_allocated_capacity = *psVar34;
              local_408._M_dataplus._M_p = (pointer)*plVar29;
            }
            local_408._M_string_length = plVar29[1];
            *plVar29 = (long)psVar34;
            plVar29[1] = 0;
            *(undefined1 *)(plVar29 + 2) = 0;
            uVar8._0_4_ = pSVar41->width;
            uVar8._4_4_ = pSVar41->vecsize;
            plVar29 = (long *)::std::__cxx11::string::_M_append((char *)&local_408,uVar8);
            local_3b0._0_8_ = local_3a0;
            pSVar22 = (SPIRVariable *)(plVar29 + 2);
            if ((SPIRVariable *)*plVar29 == pSVar22) {
              local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3a0._8_8_ = plVar29[3];
            }
            else {
              local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3b0._0_8_ = (SPIRVariable *)*plVar29;
            }
            local_3b0._8_8_ = plVar29[1];
            *plVar29 = (long)pSVar22;
            plVar29[1] = 0;
            *(undefined1 *)(plVar29 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
            if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
              operator_delete((void *)local_3b0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) {
              operator_delete(local_408._M_dataplus._M_p);
            }
            psVar15 = &local_3d8;
            _Var44._M_p = local_3d8._M_dataplus._M_p;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var44._M_p != &psVar15->field_2) {
            operator_delete(_Var44._M_p);
          }
          uVar50 = *(uint *)((long)&(pSVar41->array).buffer_capacity + 4);
          cVar19 = '\x01';
          if (9 < uVar50) {
            uVar37 = uVar50;
            cVar17 = '\x04';
            do {
              cVar19 = cVar17;
              if (uVar37 < 100) {
                cVar19 = cVar19 + -2;
                goto LAB_002e0fc8;
              }
              if (uVar37 < 1000) {
                cVar19 = cVar19 + -1;
                goto LAB_002e0fc8;
              }
              if (uVar37 < 10000) goto LAB_002e0fc8;
              bVar18 = 99999 < uVar37;
              uVar37 = uVar37 / 10000;
              cVar17 = cVar19 + '\x04';
            } while (bVar18);
            cVar19 = cVar19 + '\x01';
          }
LAB_002e0fc8:
          local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3d8,cVar19);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3d8._M_dataplus._M_p,(uint)local_3d8._M_string_length,uVar50);
          puVar26 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_3d8,0,(char *)0x0,0x3771ea);
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          psVar34 = puVar26 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar26 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar34) {
            local_408.field_2._M_allocated_capacity = *psVar34;
            local_408.field_2._8_8_ = puVar26[3];
          }
          else {
            local_408.field_2._M_allocated_capacity = *psVar34;
            local_408._M_dataplus._M_p = (pointer)*puVar26;
          }
          local_408._M_string_length = puVar26[1];
          *puVar26 = psVar34;
          puVar26[1] = 0;
          *(undefined1 *)(puVar26 + 2) = 0;
          plVar29 = (long *)::std::__cxx11::string::append((char *)&local_408);
          local_3b0._0_8_ = local_3a0;
          pSVar22 = (SPIRVariable *)(plVar29 + 2);
          if ((SPIRVariable *)*plVar29 == pSVar22) {
            local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
            local_3a0._8_8_ = plVar29[3];
          }
          else {
            local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
            local_3b0._0_8_ = (SPIRVariable *)*plVar29;
          }
          local_3b0._8_8_ = plVar29[1];
          *plVar29 = (long)pSVar22;
          plVar29[1] = 0;
          *(undefined1 *)(plVar29 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
          if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
            operator_delete((void *)local_3b0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            operator_delete(local_3d8._M_dataplus._M_p);
          }
          cVar25 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)local_370,&local_3b4.id);
          if (cVar25.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
            ::std::__cxx11::string::append((char *)local_3e8);
          }
          ::std::__cxx11::string::append((char *)local_3e8);
          break;
        case 0x12:
          if (local_3e8->_M_string_length != 0) {
            ::std::__cxx11::string::append((char *)local_3e8);
          }
          sampler_type_abi_cxx11_(&local_3d8,local_3e0,pSVar27,local_3b4.id);
          plVar29 = (long *)::std::__cxx11::string::append((char *)&local_3d8);
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          psVar34 = (size_type *)(plVar29 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar29 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar34) {
            local_408.field_2._M_allocated_capacity = *psVar34;
            local_408.field_2._8_8_ = plVar29[3];
          }
          else {
            local_408.field_2._M_allocated_capacity = *psVar34;
            local_408._M_dataplus._M_p = (pointer)*plVar29;
          }
          local_408._M_string_length = plVar29[1];
          *plVar29 = (long)psVar34;
          plVar29[1] = 0;
          *(undefined1 *)(plVar29 + 2) = 0;
          uVar46._0_4_ = pSVar41->width;
          uVar46._4_4_ = pSVar41->vecsize;
          plVar29 = (long *)::std::__cxx11::string::_M_append((char *)&local_408,uVar46);
          local_3b0._0_8_ = local_3a0;
          pSVar22 = (SPIRVariable *)(plVar29 + 2);
          if ((SPIRVariable *)*plVar29 == pSVar22) {
            local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
            local_3a0._8_8_ = plVar29[3];
          }
          else {
            local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
            local_3b0._0_8_ = (SPIRVariable *)*plVar29;
          }
          local_3b0._8_8_ = plVar29[1];
          *plVar29 = (long)pSVar22;
          plVar29[1] = 0;
          *(undefined1 *)(plVar29 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
          if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
            operator_delete((void *)local_3b0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            operator_delete(local_3d8._M_dataplus._M_p);
          }
          uVar50 = *(uint *)((long)&(pSVar41->array).buffer_capacity + 4);
          cVar19 = '\x01';
          if (9 < uVar50) {
            uVar37 = uVar50;
            cVar17 = '\x04';
            do {
              cVar19 = cVar17;
              if (uVar37 < 100) {
                cVar19 = cVar19 + -2;
                goto LAB_002e0baa;
              }
              if (uVar37 < 1000) {
                cVar19 = cVar19 + -1;
                goto LAB_002e0baa;
              }
              if (uVar37 < 10000) goto LAB_002e0baa;
              bVar18 = 99999 < uVar37;
              uVar37 = uVar37 / 10000;
              cVar17 = cVar19 + '\x04';
            } while (bVar18);
            cVar19 = cVar19 + '\x01';
          }
LAB_002e0baa:
          local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3d8,cVar19);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3d8._M_dataplus._M_p,(uint)local_3d8._M_string_length,uVar50);
          puVar26 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_3d8,0,(char *)0x0,0x3772b5);
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          psVar34 = puVar26 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar26 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar34) {
            local_408.field_2._M_allocated_capacity = *psVar34;
            local_408.field_2._8_8_ = puVar26[3];
          }
          else {
            local_408.field_2._M_allocated_capacity = *psVar34;
            local_408._M_dataplus._M_p = (pointer)*puVar26;
          }
          local_408._M_string_length = puVar26[1];
          *puVar26 = psVar34;
          puVar26[1] = 0;
          *(undefined1 *)(puVar26 + 2) = 0;
          plVar29 = (long *)::std::__cxx11::string::append((char *)&local_408);
          local_3b0._0_8_ = local_3a0;
          pSVar22 = (SPIRVariable *)(plVar29 + 2);
          if ((SPIRVariable *)*plVar29 == pSVar22) {
            local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
            local_3a0._8_8_ = plVar29[3];
          }
          else {
            local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
            local_3b0._0_8_ = (SPIRVariable *)*plVar29;
          }
          local_3b0._8_8_ = plVar29[1];
          *plVar29 = (long)pSVar22;
          plVar29[1] = 0;
          *(undefined1 *)(plVar29 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
          goto LAB_002e0d99;
        case 0x13:
          (*(local_3e0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_360,local_3e0,pSVar27);
          plVar29 = (long *)::std::__cxx11::string::replace
                                      ((ulong)&local_360,0,(char *)0x0,0x376a17);
          local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
          psVar34 = (size_type *)(plVar29 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar29 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar34) {
            local_3d8.field_2._M_allocated_capacity = *psVar34;
            local_3d8.field_2._8_8_ = plVar29[3];
          }
          else {
            local_3d8.field_2._M_allocated_capacity = *psVar34;
            local_3d8._M_dataplus._M_p = (pointer)*plVar29;
          }
          local_3d8._M_string_length = plVar29[1];
          *plVar29 = (long)psVar34;
          plVar29[1] = 0;
          *(undefined1 *)(plVar29 + 2) = 0;
          plVar29 = (long *)::std::__cxx11::string::append((char *)&local_3d8);
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          psVar34 = (size_type *)(plVar29 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar29 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar34) {
            local_408.field_2._M_allocated_capacity = *psVar34;
            local_408.field_2._8_8_ = plVar29[3];
          }
          else {
            local_408.field_2._M_allocated_capacity = *psVar34;
            local_408._M_dataplus._M_p = (pointer)*plVar29;
          }
          local_408._M_string_length = plVar29[1];
          *plVar29 = (long)psVar34;
          plVar29[1] = 0;
          *(undefined1 *)(plVar29 + 2) = 0;
          uVar49._0_4_ = pSVar41->width;
          uVar49._4_4_ = pSVar41->vecsize;
          plVar29 = (long *)::std::__cxx11::string::_M_append((char *)&local_408,uVar49);
          local_3b0._0_8_ = local_3a0;
          pSVar22 = (SPIRVariable *)(plVar29 + 2);
          if ((SPIRVariable *)*plVar29 == pSVar22) {
            local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
            local_3a0._8_8_ = plVar29[3];
          }
          else {
            local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
            local_3b0._0_8_ = (SPIRVariable *)*plVar29;
          }
          local_3b0._8_8_ = plVar29[1];
          *plVar29 = (long)pSVar22;
          plVar29[1] = 0;
          *(undefined1 *)(plVar29 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
          if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
            operator_delete((void *)local_3b0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            operator_delete(local_3d8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p != &local_360.field_2) {
            operator_delete(local_360._M_dataplus._M_p);
          }
          uVar50 = *(uint *)((long)&(pSVar41->array).buffer_capacity + 4);
          cVar19 = '\x01';
          if (9 < uVar50) {
            uVar37 = uVar50;
            cVar17 = '\x04';
            do {
              cVar19 = cVar17;
              if (uVar37 < 100) {
                cVar19 = cVar19 + -2;
                goto LAB_002e0ca5;
              }
              if (uVar37 < 1000) {
                cVar19 = cVar19 + -1;
                goto LAB_002e0ca5;
              }
              if (uVar37 < 10000) goto LAB_002e0ca5;
              bVar18 = 99999 < uVar37;
              uVar37 = uVar37 / 10000;
              cVar17 = cVar19 + '\x04';
            } while (bVar18);
            cVar19 = cVar19 + '\x01';
          }
LAB_002e0ca5:
          local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3d8,cVar19);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3d8._M_dataplus._M_p,(uint)local_3d8._M_string_length,uVar50);
          puVar26 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_3d8,0,(char *)0x0,0x3771ea);
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          psVar34 = puVar26 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar26 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar34) {
            local_408.field_2._M_allocated_capacity = *psVar34;
            local_408.field_2._8_8_ = puVar26[3];
          }
          else {
            local_408.field_2._M_allocated_capacity = *psVar34;
            local_408._M_dataplus._M_p = (pointer)*puVar26;
          }
          local_408._M_string_length = puVar26[1];
          *puVar26 = psVar34;
          puVar26[1] = 0;
          *(undefined1 *)(puVar26 + 2) = 0;
          plVar29 = (long *)::std::__cxx11::string::append((char *)&local_408);
          local_3b0._0_8_ = local_3a0;
          pSVar22 = (SPIRVariable *)(plVar29 + 2);
          if ((SPIRVariable *)*plVar29 == pSVar22) {
            local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
            local_3a0._8_8_ = plVar29[3];
          }
          else {
            local_3a0._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
            local_3b0._0_8_ = (SPIRVariable *)*plVar29;
          }
          local_3b0._8_8_ = plVar29[1];
          *plVar29 = (long)pSVar22;
          plVar29[1] = 0;
          *(undefined1 *)(plVar29 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3e8,local_3b0._0_8_);
LAB_002e0d99:
          if ((SPIRVariable *)local_3b0._0_8_ != (SPIRVariable *)local_3a0) {
            operator_delete((void *)local_3b0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            operator_delete(local_3d8._M_dataplus._M_p);
          }
        }
        pSVar41 = (SPIRType *)((pSVar41->array).stack_storage.aligned_char + 8);
      } while (pSVar41 != local_2c0);
    }
  }
  SmallVector<Resource,_8UL>::~SmallVector((SmallVector<Resource,_8UL> *)local_248);
  return;
code_r0x002df790:
  bVar18 = uVar49 < 3;
  uVar49 = uVar46;
  if (bVar18) goto LAB_002df799;
  goto LAB_002df775;
}

Assistant:

void CompilerMSL::entry_point_args_discrete_descriptors(string &ep_args)
{
	// Output resources, sorted by resource index & type
	// We need to sort to work around a bug on macOS 10.13 with NVidia drivers where switching between shaders
	// with different order of buffers can result in issues with buffer assignments inside the driver.
	struct Resource
	{
		SPIRVariable *var;
		SPIRVariable *descriptor_alias;
		string name;
		SPIRType::BaseType basetype;
		uint32_t index;
		uint32_t plane;
		uint32_t secondary_index;
	};

	SmallVector<Resource> resources;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t var_id, SPIRVariable &var) {
		if ((var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		     var.storage == StorageClassPushConstant || var.storage == StorageClassStorageBuffer) &&
		    !is_hidden_variable(var))
		{
			auto &type = get_variable_data_type(var);

			if (is_supported_argument_buffer_type(type) && var.storage != StorageClassPushConstant)
			{
				uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);
				if (descriptor_set_is_argument_buffer(desc_set))
					return;
			}

			// Handle descriptor aliasing. We can handle aliasing of buffers by casting pointers,
			// but not for typed resources.
			SPIRVariable *descriptor_alias = nullptr;
			if (var.storage == StorageClassUniform || var.storage == StorageClassStorageBuffer)
			{
				for (auto &resource : resources)
				{
					if (get_decoration(resource.var->self, DecorationDescriptorSet) ==
					    get_decoration(var_id, DecorationDescriptorSet) &&
					    get_decoration(resource.var->self, DecorationBinding) ==
					    get_decoration(var_id, DecorationBinding) &&
					    resource.basetype == SPIRType::Struct && type.basetype == SPIRType::Struct &&
					    (resource.var->storage == StorageClassUniform ||
					     resource.var->storage == StorageClassStorageBuffer))
					{
						// Possible, but horrible to implement, ignore for now.
						if (!type.array.empty())
							SPIRV_CROSS_THROW("Aliasing arrayed discrete descriptors is currently not supported.");

						descriptor_alias = resource.var;
						// Self-reference marks that we should declare the resource,
						// and it's being used as an alias (so we can emit void* instead).
						resource.descriptor_alias = resource.var;
						// Need to promote interlocked usage so that the primary declaration is correct.
						if (interlocked_resources.count(var_id))
							interlocked_resources.insert(resource.var->self);
						break;
					}
				}
			}

			const MSLConstexprSampler *constexpr_sampler = nullptr;
			if (type.basetype == SPIRType::SampledImage || type.basetype == SPIRType::Sampler)
			{
				constexpr_sampler = find_constexpr_sampler(var_id);
				if (constexpr_sampler)
				{
					// Mark this ID as a constexpr sampler for later in case it came from set/bindings.
					constexpr_samplers_by_id[var_id] = *constexpr_sampler;
				}
			}

			// Emulate texture2D atomic operations
			uint32_t secondary_index = 0;
			if (atomic_image_vars.count(var.self))
			{
				secondary_index = get_metal_resource_index(var, SPIRType::AtomicCounter, 0);
			}

			if (type.basetype == SPIRType::SampledImage)
			{
				add_resource_name(var_id);

				uint32_t plane_count = 1;
				if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
					plane_count = constexpr_sampler->planes;

				for (uint32_t i = 0; i < plane_count; i++)
					resources.push_back({ &var, descriptor_alias, to_name(var_id), SPIRType::Image,
					                      get_metal_resource_index(var, SPIRType::Image, i), i, secondary_index });

				if (type.image.dim != DimBuffer && !constexpr_sampler)
				{
					resources.push_back({ &var, descriptor_alias, to_sampler_expression(var_id), SPIRType::Sampler,
					                      get_metal_resource_index(var, SPIRType::Sampler), 0, 0 });
				}
			}
			else if (!constexpr_sampler)
			{
				// constexpr samplers are not declared as resources.
				add_resource_name(var_id);

				// Don't allocate resource indices for aliases.
				uint32_t resource_index = ~0u;
				if (!descriptor_alias)
					resource_index = get_metal_resource_index(var, type.basetype);

				resources.push_back({ &var, descriptor_alias, to_name(var_id), type.basetype,
				                      resource_index, 0, secondary_index });
			}
		}
	});

	stable_sort(resources.begin(), resources.end(), [](const Resource &lhs, const Resource &rhs) {
		return tie(lhs.basetype, lhs.index) < tie(rhs.basetype, rhs.index);
	});

	for (auto &r : resources)
	{
		auto &var = *r.var;
		auto &type = get_variable_data_type(var);

		uint32_t var_id = var.self;

		switch (r.basetype)
		{
		case SPIRType::Struct:
		{
			auto &m = ir.meta[type.self];
			if (m.members.size() == 0)
				break;

			if (r.descriptor_alias)
			{
				if (r.var == r.descriptor_alias)
				{
					auto primary_name = join("spvBufferAliasSet",
					                         get_decoration(var_id, DecorationDescriptorSet),
					                         "Binding",
					                         get_decoration(var_id, DecorationBinding));

					// Declare the primary alias as void*
					if (!ep_args.empty())
						ep_args += ", ";
					ep_args += get_argument_address_space(var) + " void* " + primary_name;
					ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
					if (interlocked_resources.count(var_id))
						ep_args += ", raster_order_group(0)";
					ep_args += "]]";
				}

				buffer_aliases_discrete.push_back(r.var->self);
			}
			else if (!type.array.empty())
			{
				if (type.array.size() > 1)
					SPIRV_CROSS_THROW("Arrays of arrays of buffers are not supported.");

				// Metal doesn't directly support this, so we must expand the
				// array. We'll declare a local array to hold these elements
				// later.
				uint32_t array_size = to_array_size_literal(type);

				if (array_size == 0)
					SPIRV_CROSS_THROW("Unsized arrays of buffers are not supported in MSL.");

				// Allow Metal to use the array<T> template to make arrays a value type
				is_using_builtin_array = true;
				buffer_arrays_discrete.push_back(var_id);
				for (uint32_t i = 0; i < array_size; ++i)
				{
					if (!ep_args.empty())
						ep_args += ", ";
					ep_args += get_argument_address_space(var) + " " + type_to_glsl(type) + "* " + to_restrict(var_id, true) +
					           r.name + "_" + convert_to_string(i);
					ep_args += " [[buffer(" + convert_to_string(r.index + i) + ")";
					if (interlocked_resources.count(var_id))
						ep_args += ", raster_order_group(0)";
					ep_args += "]]";
				}
				is_using_builtin_array = false;
			}
			else
			{
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args +=
				    get_argument_address_space(var) + " " + type_to_glsl(type) + "& " + to_restrict(var_id, true) + r.name;
				ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			break;
		}
		case SPIRType::Sampler:
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += sampler_type(type, var_id) + " " + r.name;
			ep_args += " [[sampler(" + convert_to_string(r.index) + ")]]";
			break;
		case SPIRType::Image:
		{
			if (!ep_args.empty())
				ep_args += ", ";

			// Use Metal's native frame-buffer fetch API for subpass inputs.
			const auto &basetype = get<SPIRType>(var.basetype);
			if (!type_is_msl_framebuffer_fetch(basetype))
			{
				ep_args += image_type_glsl(type, var_id) + " " + r.name;
				if (r.plane > 0)
					ep_args += join(plane_name_suffix, r.plane);
				ep_args += " [[texture(" + convert_to_string(r.index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			else
			{
				if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 3))
					SPIRV_CROSS_THROW("Framebuffer fetch on Mac is not supported before MSL 2.3.");
				ep_args += image_type_glsl(type, var_id) + " " + r.name;
				ep_args += " [[color(" + convert_to_string(r.index) + ")]]";
			}

			// Emulate texture2D atomic operations
			if (atomic_image_vars.count(var.self))
			{
				ep_args += ", device atomic_" + type_to_glsl(get<SPIRType>(basetype.image.type), 0);
				ep_args += "* " + r.name + "_atomic";
				ep_args += " [[buffer(" + convert_to_string(r.secondary_index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			break;
		}
		case SPIRType::AccelerationStructure:
			ep_args += ", " + type_to_glsl(type, var_id) + " " + r.name;
			ep_args += " [[buffer(" + convert_to_string(r.index) + ")]]";
			break;
		default:
			if (!ep_args.empty())
				ep_args += ", ";
			if (!type.pointer)
				ep_args += get_type_address_space(get<SPIRType>(var.basetype), var_id) + " " +
				           type_to_glsl(type, var_id) + "& " + r.name;
			else
				ep_args += type_to_glsl(type, var_id) + " " + r.name;
			ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
			if (interlocked_resources.count(var_id))
				ep_args += ", raster_order_group(0)";
			ep_args += "]]";
			break;
		}
	}
}